

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O3

void __thiscall
ft::deque<double,_ft::allocator<double>_>::~deque(deque<double,_ft::allocator<double>_> *this)

{
  ulong uVar1;
  
  if (this->m_map_size != 0) {
    uVar1 = 0;
    do {
      operator_delete(this->m_map[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->m_map_size);
  }
  operator_delete(this->m_map);
  return;
}

Assistant:

~deque() {
		chunk_allocator	chunk_alloc;

		for (iterator it = this->m_start; it != this->m_finish; ++it) {
			this->m_alloc.destroy(it.m_cur);
		}
		for (size_type i = 0; i < this->m_map_size; ++i) {
			chunk_alloc.destroy(this->m_map + i);
			this->m_alloc.deallocate(this->m_map[i], this->chunk_size());
		}
		chunk_alloc.deallocate(this->m_map, this->m_map_size);
	}